

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LowerLdArrViewElemWasm(Lowerer *this,Instr *instr)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  JITTimeFunctionBody *pJVar4;
  undefined4 *puVar5;
  Opnd *this_00;
  Opnd *this_01;
  Instr *pIVar6;
  Opnd *src2;
  IndirOpnd *this_02;
  RegOpnd *indexOpnd;
  Instr *newMove;
  Instr *done;
  Opnd *src1;
  Opnd *dst;
  Instr *instrPrev;
  Instr *instr_local;
  Lowerer *this_local;
  
  pJVar4 = Func::GetJITFunctionBody(this->m_func);
  bVar3 = JITTimeFunctionBody::IsWasmFunction(pJVar4);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2579,"(m_func->GetJITFunctionBody()->IsWasmFunction())",
                       "m_func->GetJITFunctionBody()->IsWasmFunction()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x257a,"(instr)","instr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (instr->m_opcode != LdArrViewElemWasm) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x257b,"(instr->m_opcode == Js::OpCode::LdArrViewElemWasm)",
                       "instr->m_opcode == Js::OpCode::LdArrViewElemWasm");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pIVar1 = instr->m_prev;
  this_00 = IR::Instr::GetDst(instr);
  this_01 = IR::Instr::GetSrc1(instr);
  bVar3 = IR::Opnd::IsFloat32(this_00);
  if ((bVar3) && (bVar3 = IR::Opnd::IsFloat32(this_01), !bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2582,"(!dst->IsFloat32() || src1->IsFloat32())",
                       "!dst->IsFloat32() || src1->IsFloat32()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar3 = IR::Opnd::IsFloat64(this_00);
  if ((bVar3) && (bVar3 = IR::Opnd::IsFloat64(this_01), !bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2583,"(!dst->IsFloat64() || src1->IsFloat64())",
                       "!dst->IsFloat64() || src1->IsFloat64()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pIVar6 = LowerWasmArrayBoundsCheck(this,instr,this_01);
  src2 = IR::Instr::GetSrc2(instr);
  this_02 = IR::Opnd::AsIndirOpnd(this_01);
  indexOpnd = IR::IndirOpnd::GetIndexOpnd(this_02);
  pIVar6 = InsertMaskableMove(false,true,this_00,this_01,src2,&indexOpnd->super_Opnd,pIVar6,this);
  pJVar4 = Func::GetJITFunctionBody(this->m_func);
  bVar3 = JITTimeFunctionBody::UsesWAsmJsFastVirtualBuffer(pJVar4);
  if (bVar3) {
    pIVar6->field_0x38 = pIVar6->field_0x38 & 0xfd | 2;
  }
  IR::Instr::Remove(instr);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerLdArrViewElemWasm(IR::Instr * instr)
{
#ifdef ENABLE_WASM
    Assert(m_func->GetJITFunctionBody()->IsWasmFunction());
    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::LdArrViewElemWasm);

    IR::Instr * instrPrev = instr->m_prev;

    IR::Opnd * dst = instr->GetDst();
    IR::Opnd * src1 = instr->GetSrc1();

    Assert(!dst->IsFloat32() || src1->IsFloat32());
    Assert(!dst->IsFloat64() || src1->IsFloat64());

    IR::Instr * done = LowerWasmArrayBoundsCheck(instr, src1);

    IR::Instr* newMove = InsertMaskableMove(false, true, dst, src1, instr->GetSrc2(), src1->AsIndirOpnd()->GetIndexOpnd(), done, this);

    if (m_func->GetJITFunctionBody()->UsesWAsmJsFastVirtualBuffer())
    {
        // We need to have an AV when accessing out of bounds memory even if the dst is not used
        // Make sure LinearScan doesn't dead store this instruction
        newMove->hasSideEffects = true;
    }

    instr->Remove();
    return instrPrev;
#else
    Assert(UNREACHED);
    return instr;
#endif
}